

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

void registerExpressionFunctions(ExpressionFunctionHandler *handler)

{
  long lVar1;
  allocator<char> local_91;
  Identifier local_90;
  string local_70;
  string local_50;
  
  lVar1 = 0x20;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               *(char **)((long)&std::__detail::__variant::
                                 __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                                 ::_S_vtable._M_arr[3]._M_data + lVar1),&local_91);
    Identifier::Identifier(&local_90,&local_50);
    ExpressionFunctionHandler::addFunction
              (handler,&local_90,
               *(ExpressionFunction *)
                ((long)&std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                        ::_S_vtable._M_arr[4]._M_data + lVar1),
               *(size_t *)
                ((long)&std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                        ::_S_vtable._M_arr[5]._M_data + lVar1),*(size_t *)(&UNK_001bdd48 + lVar1),
               *(ExpFuncSafety *)((long)&expressionFunctions[0].name + lVar1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
      operator_delete(local_90._name._M_dataplus._M_p,
                      local_90._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x4f8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)&expressionFunctions[0x1e].minParams + lVar1),
               &local_91);
    Identifier::Identifier(&local_90,&local_70);
    ExpressionFunctionHandler::addLabelFunction
              (handler,&local_90,
               *(ExpressionLabelFunction *)((long)&expressionFunctions[0x1e].maxParams + lVar1),
               *(size_t *)((long)&expressionFunctions[0x1e].safety + lVar1),
               *(size_t *)(&UNK_001be228 + lVar1),
               *(ExpFuncSafety *)((long)&expressionLabelFunctions[0].name + lVar1));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
      operator_delete(local_90._name._M_dataplus._M_p,
                      local_90._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0xc0);
  return;
}

Assistant:

void registerExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : expressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}

	for (const auto &func : expressionLabelFunctions)
	{
		handler.addLabelFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}